

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O1

FT_Error FT_Bitmap_Blend(FT_Library library,FT_Bitmap *source_,FT_Vector source_offset_,
                        FT_Bitmap *target,FT_Vector *atarget_offset,FT_Color color)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uchar *puVar8;
  int iVar9;
  ulong uVar10;
  char cVar11;
  undefined4 uVar12;
  undefined8 extraout_RDX;
  char cVar13;
  byte *pbVar14;
  uint uVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  ulong uVar19;
  int *piVar20;
  FT_Memory pFVar21;
  uint *puVar22;
  ulong uVar23;
  bool bVar24;
  FT_Error error;
  FT_Bitmap source_bitmap;
  FT_Error local_dc;
  ulong local_d8;
  byte *local_d0;
  undefined8 local_c8;
  ulong local_c0;
  byte *local_b8;
  byte *local_b0;
  int *local_a8;
  FT_Memory local_a0;
  ulong local_98;
  int local_8c;
  long local_88;
  uint *local_80;
  uchar *local_78;
  ulong local_70;
  byte *local_68;
  byte *local_60;
  FT_Bitmap local_58;
  
  local_dc = 0;
  if ((((atarget_offset == (FT_Vector *)0x0) || (source_ == (FT_Bitmap *)0x0)) ||
      (library == (FT_Library)0x0)) || (target == (FT_Bitmap *)0x0)) {
    return 6;
  }
  local_a0 = library->memory;
  uVar1 = target->pixel_mode;
  if (uVar1 != '\0') {
    if (uVar1 != '\a') {
      return 6;
    }
    if (target->buffer == (uchar *)0x0) {
      return 6;
    }
  }
  if (source_->pixel_mode == '\0') {
    return 0;
  }
  piVar20 = &source_->pitch;
  if ((uVar1 == '\a') && ((target->pitch ^ *piVar20) < 0)) {
    return 6;
  }
  puVar22 = &source_->width;
  if (*puVar22 == 0) {
    return 0;
  }
  if (source_->rows == 0) {
    return 0;
  }
  local_b0 = (byte *)0x7fffffffffffffff;
  uVar10 = source_offset_.y & 0xffffffffffffffc0;
  uVar16 = (ulong)(source_->rows << 6);
  if ((long)uVar10 < (long)(uVar16 + 0x8000000000000040)) {
    return 6;
  }
  uVar23 = source_offset_.x & 0xffffffffffffffc0;
  uVar19 = (ulong)(*puVar22 << 6);
  if ((long)(0x7fffffffffffffbf - uVar19) < (long)uVar23) {
    return 6;
  }
  uVar5 = target->width;
  local_c8 = CONCAT44(local_c8._4_4_,uVar5);
  if ((uVar5 == 0) || (target->rows == 0)) {
    local_d8 = 0x8000000000000000;
    local_d0 = (byte *)0x8000000000000000;
    local_98 = 0x7fffffffffffffff;
  }
  else {
    local_d8 = atarget_offset->y & 0xffffffffffffffc0;
    uVar18 = (ulong)(target->rows << 6);
    if ((long)local_d8 < (long)(uVar18 + 0x8000000000000000)) {
      return 6;
    }
    local_98 = atarget_offset->x & 0xffffffffffffffc0;
    if ((long)((ulong)(uVar5 << 6) ^ 0x7fffffffffffffff) < (long)local_98) {
      return 6;
    }
    local_b0 = (byte *)(local_d8 - uVar18);
    local_d0 = (byte *)((uVar5 << 6) + local_98);
  }
  local_60 = (byte *)(uVar10 - uVar16);
  pbVar14 = (byte *)(uVar19 + uVar23);
  uVar16 = local_98;
  if ((long)uVar23 < (long)local_98) {
    uVar16 = uVar23;
  }
  pbVar17 = local_b0;
  if ((long)local_60 < (long)local_b0) {
    pbVar17 = local_60;
  }
  if ((long)pbVar14 <= (long)local_d0) {
    pbVar14 = local_d0;
  }
  uVar19 = local_d8;
  if ((long)local_d8 < (long)uVar10) {
    uVar19 = uVar10;
  }
  uVar6 = (uint)((long)pbVar14 - uVar16 >> 6);
  if (uVar6 == 0) {
    return 0;
  }
  uVar19 = uVar19 - (long)pbVar17;
  uVar15 = (uint)(uVar19 >> 6);
  if (uVar15 == 0) {
    return 0;
  }
  if ((uVar5 != 0) && (target->rows != 0)) {
    local_98 = local_98 - uVar16;
    local_b0 = local_b0 + -(long)pbVar17;
  }
  if (uVar1 == '\0') {
    target->width = uVar6;
    target->rows = uVar15;
    target->pixel_mode = '\a';
    iVar7 = uVar6 * 4;
    target->pitch = iVar7;
    target->num_grays = 0x100;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)iVar7),0) <
        (long)(int)uVar15) {
      return 6;
    }
    local_d8 = uVar19;
    local_c0 = uVar16;
    local_b8 = pbVar17;
    local_a8 = piVar20;
    puVar8 = (uchar *)ft_mem_alloc(local_a0,(long)(int)(iVar7 * uVar15),&local_dc);
    target->buffer = puVar8;
    if (local_dc != 0) {
      return local_dc;
    }
    uVar12 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    piVar20 = local_a8;
  }
  else if ((uVar5 == uVar6) && (target->rows == uVar15)) {
    uVar12 = 0;
    local_c0 = uVar16;
    local_d8 = uVar19;
    local_b8 = pbVar17;
  }
  else {
    iVar7 = target->pitch;
    iVar9 = -iVar7;
    if (0 < iVar7) {
      iVar9 = iVar7;
    }
    local_c8 = CONCAT44(local_c8._4_4_,iVar9);
    local_8c = uVar6 * 4;
    local_88 = (long)local_8c;
    iVar7 = 1;
    if ((long)(int)uVar15 <=
        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_88),0)) {
      local_d8 = uVar19;
      local_c0 = uVar16;
      local_b8 = pbVar17;
      local_a8 = piVar20;
      local_80 = puVar22;
      local_70 = uVar19 >> 6;
      puVar8 = (uchar *)ft_mem_alloc(local_a0,(long)(int)(local_8c * uVar15),&local_dc);
      iVar7 = 0xe;
      uVar16 = local_c0;
      uVar19 = local_d8;
      pbVar17 = local_b8;
      piVar20 = local_a8;
      puVar22 = local_80;
      if (local_dc == 0) {
        local_78 = puVar8;
        if (-1 < target->pitch) {
          iVar7 = target->rows * (int)local_c8;
          if (0 < iVar7) {
            pbVar14 = target->buffer;
            local_68 = pbVar14 + iVar7;
            pbVar17 = puVar8 + ((long)local_98 >> 4 & 0xfffffffffffffffcU) +
                               ((local_70 & 0xffffffff) -
                               (((long)local_b0 >> 6) + (ulong)target->rows)) * local_88;
            local_c8 = local_c8 & 0xffffffff;
            do {
              local_d0 = pbVar14;
              local_b0 = pbVar17;
              memcpy(pbVar17,pbVar14,local_c8);
              pbVar14 = local_d0 + local_c8;
              pbVar17 = local_b0 + local_88;
            } while (pbVar14 < local_68);
          }
        }
        ft_mem_free(local_a0,target->buffer);
        target->width = uVar6;
        target->rows = (uint)local_70;
        iVar7 = -local_8c;
        if (-1 < target->pitch) {
          iVar7 = local_8c;
        }
        target->pitch = iVar7;
        target->buffer = local_78;
        iVar7 = 0;
        uVar16 = local_c0;
        uVar19 = local_d8;
        pbVar17 = local_b8;
        piVar20 = local_a8;
        puVar22 = local_80;
      }
    }
    uVar12 = 0;
    cVar11 = '\0';
    if (iVar7 == 0xe) {
      cVar13 = '\x01';
      goto LAB_00272d13;
    }
    local_c0 = uVar16;
    local_d8 = uVar19;
    local_b8 = pbVar17;
    if (iVar7 != 0) {
      return 6;
    }
  }
  local_98 = CONCAT44(local_98._4_4_,uVar12);
  bVar24 = source_->pixel_mode == '\x02';
  local_88 = CONCAT71(local_88._1_7_,bVar24);
  if (!bVar24) {
    local_58.buffer = (uchar *)0x0;
    local_58.num_grays = 0;
    local_58.pixel_mode = '\0';
    local_58.palette_mode = '\0';
    local_58._28_4_ = 0;
    local_58.rows = 0;
    local_58.width = 0;
    local_58.pitch = 0;
    local_58._12_4_ = 0;
    local_58.palette = (void *)0x0;
    local_dc = FT_Bitmap_Convert(library,source_,&local_58,1);
    if (local_dc != 0) {
      cVar13 = '\x01';
      cVar11 = (char)local_98;
      goto LAB_00272d13;
    }
    piVar20 = &local_58.pitch;
    puVar22 = &local_58.width;
    source_ = &local_58;
  }
  if (-1 < (long)target->pitch) {
    local_b0 = (byte *)((long)*piVar20 * (long)(int)source_->rows);
    if (0 < (int)local_b0) {
      local_d0 = source_->buffer;
      local_b0 = local_b0 + (long)local_d0;
      local_c8 = CONCAT44(local_c8._4_4_,(uint)color >> 8) & 0xffffffff000000ff;
      pFVar21 = (FT_Memory)
                (target->buffer +
                ((long)(uVar23 - local_c0) >> 4 & 0xfffffffffffffffcU) +
                ((ulong)target->rows -
                (((long)local_60 - (long)local_b8 >> 6) + (ulong)source_->rows)) *
                (long)target->pitch);
      do {
        local_a0 = pFVar21;
        uVar5 = *puVar22;
        if ((ulong)uVar5 != 0) {
          pFVar21 = local_a0;
          pbVar14 = local_d0;
          do {
            uVar6 = (uint)*pbVar14 * ((uint)color >> 0x18);
            uVar15 = uVar6 / 0xff;
            iVar7 = 0xff - uVar15;
            bVar2 = *(byte *)((long)&pFVar21->user + 1);
            bVar3 = *(byte *)((long)&pFVar21->user + 2);
            bVar4 = *(byte *)((long)&pFVar21->user + 3);
            *(char *)&pFVar21->user =
                 (char)((ulong)((uint)*(byte *)&pFVar21->user * iVar7) * 0x1010102 >> 0x20) +
                 (char)((ulong)(uVar15 * ((uint)color & 0xff)) * 0x1010102 >> 0x20);
            *(char *)((long)&pFVar21->user + 1) =
                 (char)((ulong)((uint)bVar2 * iVar7) * 0x1010102 >> 0x20) +
                 (char)((ulong)(uVar15 * (int)local_c8) * 0x1010102 >> 0x20);
            *(char *)((long)&pFVar21->user + 2) =
                 (char)((ulong)((uint)bVar3 * iVar7) * 0x1010102 >> 0x20) +
                 (char)((ulong)(uVar15 * ((uint)color >> 0x10 & 0xff)) * 0x1010102 >> 0x20);
            *(char *)((long)&pFVar21->user + 3) =
                 (char)((ulong)((uint)bVar4 * iVar7) * 0x1010102 >> 0x20) +
                 (char)((ulong)uVar6 * 0x1010102 >> 0x20);
            pbVar14 = pbVar14 + 1;
            pFVar21 = (FT_Memory)((long)&pFVar21->user + 4);
          } while (pbVar14 < local_d0 + uVar5);
        }
        local_d0 = local_d0 + *piVar20;
        pFVar21 = (FT_Memory)((long)&local_a0->user + (long)target->pitch);
        local_a8 = piVar20;
        local_80 = puVar22;
      } while (local_d0 < local_b0);
    }
  }
  atarget_offset->x = local_c0;
  atarget_offset->y = (FT_Pos)(local_b8 + ((uint)local_d8 & 0xffffffc0));
  cVar13 = (char)local_88;
  cVar11 = (char)local_98;
LAB_00272d13:
  if (((target != (FT_Bitmap *)0x0) && (cVar11 != '\0')) && (local_dc != 0)) {
    ft_mem_free(library->memory,target->buffer);
    target->buffer = (uchar *)0x0;
    target->num_grays = 0;
    target->pixel_mode = '\0';
    target->palette_mode = '\0';
    *(undefined4 *)&target->field_0x1c = 0;
    target->rows = 0;
    target->width = 0;
    *(undefined8 *)&target->pitch = 0;
    target->palette = (void *)0x0;
  }
  if (cVar13 == '\0') {
    ft_mem_free(library->memory,local_58.buffer);
    return local_dc;
  }
  return local_dc;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Blend( FT_Library        library,
                   const FT_Bitmap*  source_,
                   const FT_Vector   source_offset_,
                   FT_Bitmap*        target,
                   FT_Vector        *atarget_offset,
                   FT_Color          color )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Memory  memory;

    FT_Bitmap         source_bitmap;
    const FT_Bitmap*  source;

    FT_Vector  source_offset;
    FT_Vector  target_offset;

    FT_Bool  free_source_bitmap          = 0;
    FT_Bool  free_target_bitmap_on_error = 0;

    FT_Pos  source_llx, source_lly, source_urx, source_ury;
    FT_Pos  target_llx, target_lly, target_urx, target_ury;
    FT_Pos  final_llx, final_lly, final_urx, final_ury;

    unsigned int  final_rows, final_width;
    long          x, y;


    if ( !library || !target || !source_ || !atarget_offset )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( !( target->pixel_mode == FT_PIXEL_MODE_NONE     ||
            ( target->pixel_mode == FT_PIXEL_MODE_BGRA &&
              target->buffer                           ) ) )
      return FT_THROW( Invalid_Argument );

    if ( source_->pixel_mode == FT_PIXEL_MODE_NONE )
      return FT_Err_Ok;               /* nothing to do */

    /* pitches must have the same sign */
    if ( target->pixel_mode == FT_PIXEL_MODE_BGRA &&
         ( source_->pitch ^ target->pitch ) < 0   )
      return FT_THROW( Invalid_Argument );

    if ( !( source_->width && source_->rows ) )
      return FT_Err_Ok;               /* nothing to do */

    /* assure integer pixel offsets */
    source_offset.x = FT_PIX_FLOOR( source_offset_.x );
    source_offset.y = FT_PIX_FLOOR( source_offset_.y );
    target_offset.x = FT_PIX_FLOOR( atarget_offset->x );
    target_offset.y = FT_PIX_FLOOR( atarget_offset->y );

    /* get source bitmap dimensions */
    source_llx = source_offset.x;
    if ( FT_LONG_MIN + (FT_Pos)( source_->rows << 6 ) + 64 > source_offset.y )
    {
      FT_TRACE5((
        "FT_Bitmap_Blend: y coordinate overflow in source bitmap\n" ));
      return FT_THROW( Invalid_Argument );
    }
    source_lly = source_offset.y - ( source_->rows << 6 );

    if ( FT_LONG_MAX - (FT_Pos)( source_->width << 6 ) - 64 < source_llx )
    {
      FT_TRACE5((
        "FT_Bitmap_Blend: x coordinate overflow in source bitmap\n" ));
      return FT_THROW( Invalid_Argument );
    }
    source_urx = source_llx + ( source_->width << 6 );
    source_ury = source_offset.y;

    /* get target bitmap dimensions */
    if ( target->width && target->rows )
    {
      target_llx = target_offset.x;
      if ( FT_LONG_MIN + (FT_Pos)( target->rows << 6 ) > target_offset.y )
      {
        FT_TRACE5((
          "FT_Bitmap_Blend: y coordinate overflow in target bitmap\n" ));
        return FT_THROW( Invalid_Argument );
      }
      target_lly = target_offset.y - ( target->rows << 6 );

      if ( FT_LONG_MAX - (FT_Pos)( target->width << 6 ) < target_llx )
      {
        FT_TRACE5((
          "FT_Bitmap_Blend: x coordinate overflow in target bitmap\n" ));
        return FT_THROW( Invalid_Argument );
      }
      target_urx = target_llx + ( target->width << 6 );
      target_ury = target_offset.y;
    }
    else
    {
      target_llx = FT_LONG_MAX;
      target_lly = FT_LONG_MAX;
      target_urx = FT_LONG_MIN;
      target_ury = FT_LONG_MIN;
    }

    /* compute final bitmap dimensions */
    final_llx = FT_MIN( source_llx, target_llx );
    final_lly = FT_MIN( source_lly, target_lly );
    final_urx = FT_MAX( source_urx, target_urx );
    final_ury = FT_MAX( source_ury, target_ury );

    final_width = ( final_urx - final_llx ) >> 6;
    final_rows  = ( final_ury - final_lly ) >> 6;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE5(( "FT_Bitmap_Blend:\n" ));
    FT_TRACE5(( "  source bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
      source_llx / 64, source_lly / 64,
      source_urx / 64, source_ury / 64,
      source_->width, source_->rows ));

    if ( target->width && target->rows )
      FT_TRACE5(( "  target bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
        target_llx / 64, target_lly / 64,
        target_urx / 64, target_ury / 64,
        target->width, target->rows ));
    else
      FT_TRACE5(( "  target bitmap: empty\n" ));

    if ( final_width && final_rows )
      FT_TRACE5(( "  final bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
        final_llx / 64, final_lly / 64,
        final_urx / 64, final_ury / 64,
        final_width, final_rows ));
    else
      FT_TRACE5(( "  final bitmap: empty\n" ));
#endif /* FT_DEBUG_LEVEL_TRACE */

    if ( !( final_width && final_rows ) )
      return FT_Err_Ok;               /* nothing to do */

    /* for blending, set offset vector of final bitmap */
    /* temporarily to (0,0)                            */
    source_llx -= final_llx;
    source_lly -= final_lly;

    if ( target->width && target->rows )
    {
      target_llx -= final_llx;
      target_lly -= final_lly;
    }

    /* set up target bitmap */
    if ( target->pixel_mode == FT_PIXEL_MODE_NONE )
    {
      /* create new empty bitmap */
      target->width      = final_width;
      target->rows       = final_rows;
      target->pixel_mode = FT_PIXEL_MODE_BGRA;
      target->pitch      = (int)final_width * 4;
      target->num_grays  = 256;

      if ( FT_LONG_MAX / target->pitch < (int)target->rows )
      {
        FT_TRACE5(( "FT_Blend_Bitmap: target bitmap too large (%d x %d)\n",
                     final_width, final_rows ));
        return FT_THROW( Invalid_Argument );
      }

      if ( FT_ALLOC( target->buffer, target->pitch * (int)target->rows ) )
        return error;

      free_target_bitmap_on_error = 1;
    }
    else if ( target->width != final_width ||
              target->rows  != final_rows  )
    {
      /* adjust old bitmap to enlarged size */
      int  pitch, new_pitch;

      unsigned char*  buffer = NULL;


      pitch = target->pitch;

      if ( pitch < 0 )
        pitch = -pitch;

      new_pitch = (int)final_width * 4;

      if ( FT_LONG_MAX / new_pitch < (int)final_rows )
      {
        FT_TRACE5(( "FT_Blend_Bitmap: target bitmap too large (%d x %d)\n",
                     final_width, final_rows ));
        return FT_THROW( Invalid_Argument );
      }

      /* TODO: provide an in-buffer solution for large bitmaps */
      /*       to avoid allocation of a new buffer             */
      if ( FT_ALLOC( buffer, new_pitch * (int)final_rows ) )
        goto Error;

      /* copy data to new buffer */
      x = target_llx >> 6;
      y = target_lly >> 6;

      /* the bitmap flow is from top to bottom, */
      /* but y is measured from bottom to top   */
      if ( target->pitch < 0 )
      {
        /* XXX */
      }
      else
      {
        unsigned char*  p =
          target->buffer;
        unsigned char*  q =
          buffer +
          ( final_rows - y - target->rows ) * new_pitch +
          x * 4;
        unsigned char*  limit_p =
          p + pitch * (int)target->rows;


        while ( p < limit_p )
        {
          FT_MEM_COPY( q, p, pitch );

          p += pitch;
          q += new_pitch;
        }
      }

      FT_FREE( target->buffer );

      target->width = final_width;
      target->rows  = final_rows;

      if ( target->pitch < 0 )
        target->pitch = -new_pitch;
      else
        target->pitch = new_pitch;

      target->buffer = buffer;
    }

    /* adjust source bitmap if necessary */
    if ( source_->pixel_mode != FT_PIXEL_MODE_GRAY )
    {
      FT_Bitmap_Init( &source_bitmap );
      error = FT_Bitmap_Convert( library, source_, &source_bitmap, 1 );
      if ( error )
        goto Error;

      source             = &source_bitmap;
      free_source_bitmap = 1;
    }
    else
      source = source_;

    /* do blending; the code below returns pre-multiplied channels, */
    /* similar to what FreeType gets from `CBDT' tables             */
    x = source_llx >> 6;
    y = source_lly >> 6;

    /* the bitmap flow is from top to bottom, */
    /* but y is measured from bottom to top   */
    if ( target->pitch < 0 )
    {
      /* XXX */
    }
    else
    {
      unsigned char*  p =
        source->buffer;
      unsigned char*  q =
        target->buffer +
        ( target->rows - y - source->rows ) * target->pitch +
        x * 4;
      unsigned char*  limit_p =
        p + source->pitch * (int)source->rows;


      while ( p < limit_p )
      {
        unsigned char*  r       = p;
        unsigned char*  s       = q;
        unsigned char*  limit_r = r + source->width;


        while ( r < limit_r )
        {
          int  aa = *r++;
          int  fa = color.alpha * aa / 255;

          int  fb = color.blue * fa / 255;
          int  fg = color.green * fa / 255;
          int  fr = color.red * fa / 255;

          int  ba2 = 255 - fa;

          int  bb = s[0];
          int  bg = s[1];
          int  br = s[2];
          int  ba = s[3];


          *s++ = (unsigned char)( bb * ba2 / 255 + fb );
          *s++ = (unsigned char)( bg * ba2 / 255 + fg );
          *s++ = (unsigned char)( br * ba2 / 255 + fr );
          *s++ = (unsigned char)( ba * ba2 / 255 + fa );
        }

        p += source->pitch;
        q += target->pitch;
      }
    }

    atarget_offset->x = final_llx;
    atarget_offset->y = final_lly + ( final_rows << 6 );

  Error:
    if ( error && free_target_bitmap_on_error )
      FT_Bitmap_Done( library, target );

    if ( free_source_bitmap )
      FT_Bitmap_Done( library, &source_bitmap );

    return error;
  }